

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-tx.cpp
# Opt level: O2

uint TrimAndParse<unsigned_int>(string *int_str,string *err)

{
  optional<unsigned_int> oVar1;
  runtime_error *this;
  long in_FS_OFFSET;
  string_view pattern;
  string_view sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2._M_str = (int_str->_M_dataplus)._M_p;
  sVar2._M_len = int_str->_M_string_length;
  pattern._M_str = " \f\n\r\t\v";
  pattern._M_len = 6;
  sVar2 = util::TrimStringView(sVar2,pattern);
  oVar1 = ToIntegral<unsigned_int>(sVar2);
  if (((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&bStack_88,err," \'");
    std::operator+(&local_68,&bStack_88,int_str);
    std::operator+(&local_48,&local_68,"\'");
    std::runtime_error::runtime_error(this,(string *)&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
  }
  __stack_chk_fail();
}

Assistant:

static T TrimAndParse(const std::string& int_str, const std::string& err)
{
    const auto parsed{ToIntegral<T>(TrimStringView(int_str))};
    if (!parsed.has_value()) {
        throw std::runtime_error(err + " '" + int_str + "'");
    }
    return parsed.value();
}